

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_index.h
# Opt level: O1

void __thiscall S2CellIndex::Add(S2CellIndex *this,S2CellId cell_id,Label label)

{
  pointer *ppCVar1;
  iterator __position;
  CellNode local_18;
  
  if (((uint)(cell_id.id_ >> 0x3e) < 3) && ((-cell_id.id_ & cell_id.id_ & 0x1555555555555555) != 0))
  {
    if (-1 < label) {
      local_18.parent = -1;
      __position._M_current =
           (this->cell_tree_).
           super__Vector_base<S2CellIndex::CellNode,_std::allocator<S2CellIndex::CellNode>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->cell_tree_).
          super__Vector_base<S2CellIndex::CellNode,_std::allocator<S2CellIndex::CellNode>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_18.cell_id.id_ = cell_id.id_;
        local_18.label = label;
        std::vector<S2CellIndex::CellNode,_std::allocator<S2CellIndex::CellNode>_>::
        _M_realloc_insert<S2CellIndex::CellNode>(&this->cell_tree_,__position,&local_18);
      }
      else {
        ((__position._M_current)->cell_id).id_ = cell_id.id_;
        (__position._M_current)->label = label;
        (__position._M_current)->parent = 0xffffffff;
        ppCVar1 = &(this->cell_tree_).
                   super__Vector_base<S2CellIndex::CellNode,_std::allocator<S2CellIndex::CellNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + 1;
      }
      return;
    }
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_index.h"
               ,0x267,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)CONCAT44(local_18.parent,local_18.label),"Check failed: (label) >= (0) ",
               0x1d);
  }
  else {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_index.h"
               ,0x266,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)CONCAT44(local_18.parent,local_18.label),
               "Check failed: cell_id.is_valid() ",0x21);
  }
  abort();
}

Assistant:

inline void S2CellIndex::NonEmptyRangeIterator::Next() {
  do {
    RangeIterator::Next();
  } while (is_empty() && !done());
}